

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O0

char * image_format_to_string(aom_img_fmt_t fmt)

{
  aom_img_fmt_t fmt_local;
  char *local_8;
  
  if (fmt == AOM_IMG_FMT_I420) {
    local_8 = "I420";
  }
  else if (fmt == AOM_IMG_FMT_I422) {
    local_8 = "I422";
  }
  else if (fmt == AOM_IMG_FMT_I444) {
    local_8 = "I444";
  }
  else if (fmt == AOM_IMG_FMT_NV12) {
    local_8 = "NV12";
  }
  else if (fmt == AOM_IMG_FMT_YV12) {
    local_8 = "YV12";
  }
  else if (fmt == AOM_IMG_FMT_I42016) {
    local_8 = "I42016";
  }
  else if (fmt == AOM_IMG_FMT_I42216) {
    local_8 = "I42216";
  }
  else if (fmt == AOM_IMG_FMT_I44416) {
    local_8 = "I44416";
  }
  else if (fmt == AOM_IMG_FMT_YV1216) {
    local_8 = "YV1216";
  }
  else {
    local_8 = "Other";
  }
  return local_8;
}

Assistant:

const char *image_format_to_string(aom_img_fmt_t fmt) {
  switch (fmt) {
    case AOM_IMG_FMT_I420: return "I420";
    case AOM_IMG_FMT_I422: return "I422";
    case AOM_IMG_FMT_I444: return "I444";
    case AOM_IMG_FMT_YV12: return "YV12";
    case AOM_IMG_FMT_NV12: return "NV12";
    case AOM_IMG_FMT_YV1216: return "YV1216";
    case AOM_IMG_FMT_I42016: return "I42016";
    case AOM_IMG_FMT_I42216: return "I42216";
    case AOM_IMG_FMT_I44416: return "I44416";
    default: return "Other";
  }
}